

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIMultiplayer.cpp
# Opt level: O2

void XPMP2::AIMultiClearTcasDataRefs(void)

{
  allocator_type local_25;
  value_type_conflict4 local_24;
  vector<int,_std::allocator<int>_> nullArr;
  
  if (drTcasModeS != 0) {
    local_24 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&nullArr,CONCAT44(numSlots._4_4_,(undefined4)numSlots),&local_24,&local_25);
    XPLMSetDatavi(drTcasModeS,
                  nullArr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,1,(undefined4)numSlots);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&nullArr.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void AIMultiClearTcasDataRefs ()
{
    if (drTcasModeS) {
        std::vector<int> nullArr (numSlots, 0);
        XPLMSetDatavi(drTcasModeS, nullArr.data(), 1, (int)numSlots);
    }
}